

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

int __thiscall Units::setFlowFactor(Units *this,int flowUnits)

{
  allocator local_41;
  string local_40 [8];
  string s;
  double local_20;
  double flowFactor;
  int unitSystem;
  int flowUnits_local;
  Units *this_local;
  
  flowFactor._0_4_ = 0;
  local_20 = 1.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"CFS",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  switch(flowUnits) {
  case 0:
    local_20 = 1.0;
    std::__cxx11::string::operator=(local_40,"CFS");
    break;
  case 1:
    local_20 = 448.831;
    std::__cxx11::string::operator=(local_40,"GPM");
    break;
  case 2:
    local_20 = 0.64632;
    std::__cxx11::string::operator=(local_40,"MGD");
    break;
  case 3:
    local_20 = 0.5382;
    std::__cxx11::string::operator=(local_40,"IMGD");
    break;
  case 4:
    local_20 = 1.9837;
    std::__cxx11::string::operator=(local_40,"AFD");
    break;
  case 5:
    local_20 = 28.317;
    std::__cxx11::string::operator=(local_40,"LPS");
    flowFactor._0_4_ = 1;
    break;
  case 6:
    local_20 = 1699.0;
    std::__cxx11::string::operator=(local_40,"LPM");
    flowFactor._0_4_ = 1;
    break;
  case 7:
    local_20 = 2.4466;
    std::__cxx11::string::operator=(local_40,"MLD");
    flowFactor._0_4_ = 1;
    break;
  case 8:
    local_20 = 101.94;
    std::__cxx11::string::operator=(local_40,"CMH");
    flowFactor._0_4_ = 1;
    break;
  case 9:
    local_20 = 2446.6;
    std::__cxx11::string::operator=(local_40,"CMD");
    flowFactor._0_4_ = 1;
  }
  this->factors[5] = local_20;
  std::__cxx11::string::operator=((string *)&this->field_0xe8,local_40);
  std::__cxx11::string::~string(local_40);
  return flowFactor._0_4_;
}

Assistant:

int Units::setFlowFactor(const int flowUnits)
{
    int    unitSystem = Options::US;
    double flowFactor = 1.0;
    string s = "CFS";

    switch(flowUnits)
    {
    case Options::CFS:  flowFactor = 1.0;
                        s = "CFS";
                        break;
    case Options::GPM:  flowFactor = GPMperCFS;
                        s = "GPM";
                        break;
    case Options::MGD:  flowFactor = MGDperCFS;
                        s = "MGD";
                        break;
    case Options::IMGD: flowFactor = IMGDperCFS;
                        s = "IMGD";
                        break;
    case Options::AFD:  flowFactor = AFDperCFS;
                        s = "AFD";
                        break;

    case Options::LPS:  flowFactor = LPSperCFS;
                        s = "LPS";
                        unitSystem = Options::SI;
                        break;
    case Options::LPM:  flowFactor = LPMperCFS;
                        s = "LPM";
                        unitSystem = Options::SI;
                        break;
    case Options::MLD:  flowFactor = MLDperCFS;
                        s = "MLD";
                        unitSystem = Options::SI;
                        break;
    case Options::CMH:  flowFactor = CMHperCFS;
                        s = "CMH";
                        unitSystem = Options::SI;
                        break;
    case Options::CMD:  flowFactor = CMDperCFS;
                        s = "CMD";
                        unitSystem = Options::SI;
                        break;
    }
    factors[FLOW] = flowFactor;
    names[FLOW] = s;
    return unitSystem;
}